

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ResultBuilder::captureExpression(ResultBuilder *this)

{
  byte bVar1;
  int iVar2;
  IResultCapture *pIVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  AssertionResult result;
  Ptr<const_Catch::IConfig> local_d0;
  AssertionResult local_c8;
  
  build(&local_c8,this);
  pIVar3 = getResultCapture();
  (*pIVar3->_vptr_IResultCapture[2])(pIVar3,&local_c8);
  if ((((undefined1)local_c8.m_resultData.resultType & FailureBit) != Ok) &&
     ((local_c8.m_info.resultDisposition & SuppressFail) == Normal)) {
    pIVar4 = getCurrentMutableContext();
    (*(pIVar4->super_IContext)._vptr_IContext[6])(&local_d0,pIVar4);
    iVar2 = (*((local_d0.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[8])();
    Ptr<const_Catch::IConfig>::~Ptr(&local_d0);
    if ((char)iVar2 != '\0') {
      this->m_shouldDebugBreak = true;
    }
    pIVar4 = getCurrentMutableContext();
    iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[3])(pIVar4);
    bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if ((bVar1 | (this->m_assertionInfo).resultDisposition == Normal) == 1) {
      this->m_shouldThrow = true;
    }
  }
  AssertionResult::~AssertionResult(&local_c8);
  return;
}

Assistant:

void ResultBuilder::captureExpression() {
        AssertionResult result = build();
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || m_assertionInfo.resultDisposition == ResultDisposition::Normal )
                m_shouldThrow = true;
        }
    }